

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

void __thiscall
DnsStats::SubmitRegistryNumberAndCount
          (DnsStats *this,uint32_t registry_id,uint32_t number,uint64_t count)

{
  bool stored;
  DnsHashEntry key;
  bool local_89;
  DnsHashEntry local_88;
  
  DnsHashEntry::DnsHashEntry(&local_88);
  local_89 = false;
  local_88.key_type = 0;
  local_88.key_length = 4;
  local_88.registry_id = registry_id;
  local_88.count = count;
  local_88.field_6.key_number = number;
  BinHash<DnsHashEntry>::InsertOrAdd(&this->hashTable,&local_88,true,&local_89);
  DnsHashEntry::~DnsHashEntry(&local_88);
  return;
}

Assistant:

void DnsStats::SubmitRegistryNumberAndCount(uint32_t registry_id, uint32_t number, uint64_t count)
{
    DnsHashEntry key;
    bool stored = false;

    key.count = count;
    key.registry_id = registry_id;
    key.key_length = sizeof(uint32_t);
    key.key_type = 0; /* number */
    key.key_number = number;

    (void)hashTable.InsertOrAdd(&key, true, &stored);
}